

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::RefPtr<wabt::interp::Memory>::RefPtr
          (RefPtr<wabt::interp::Memory> *this,Store *store,Ref ref)

{
  long lVar1;
  long lVar2;
  size_t *psVar3;
  size_t sVar4;
  size_t sVar5;
  Module *pMVar6;
  bool bVar7;
  Index IVar8;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar9;
  Frame *pFVar10;
  size_t *psVar11;
  Ref ref_00;
  Frame *pFVar12;
  Store *this_00;
  Ref RVar13;
  Ref RStack_48;
  Store *pSStack_40;
  RefPtr<wabt::interp::Memory> *pRStack_38;
  size_t sStack_30;
  Ref local_20;
  
  sStack_30 = 0x18ffeb;
  bVar7 = Store::Is<wabt::interp::Memory>(store,ref);
  if (bVar7) {
    sStack_30 = 0x190000;
    local_20.index = ref.index;
    IVar8 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar8;
    sStack_30 = 0x190010;
    puVar9 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&store->objects_,ref.index);
    this->obj_ = (Memory *)
                 (puVar9->_M_t).
                 super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                 .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    this->store_ = store;
    return;
  }
  sStack_30 = 0x19002f;
  this_00 = store;
  RVar13.index = ref.index;
  interp::RefPtr();
  pSStack_40 = store;
  pRStack_38 = this;
  sStack_30 = ref.index;
  bVar7 = Store::Is<wabt::interp::Func>(this_00,ref_00);
  if (bVar7) {
    IVar8 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this_00->roots_,&RStack_48);
    *(Index *)(RVar13.index + 0x10) = IVar8;
    puVar9 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&this_00->objects_,ref_00.index);
    *(Object **)RVar13.index =
         (puVar9->_M_t).
         super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>.
         _M_t.
         super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
         super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    *(Store **)(RVar13.index + 8) = this_00;
    return;
  }
  RVar13.index = ref_00.index;
  interp::RefPtr();
  if ((ulong)this_00 >> 0x3a == 0) {
    lVar1 = *(long *)RVar13.index;
    if ((Store *)(*(long *)(RVar13.index + 0x10) - lVar1 >> 5) < this_00) {
      lVar2 = *(long *)(RVar13.index + 8);
      pFVar10 = __gnu_cxx::new_allocator<wabt::interp::Frame>::allocate
                          ((new_allocator<wabt::interp::Frame> *)RVar13.index,(size_type)this_00,
                           (void *)0x0);
      psVar3 = *(size_t **)(RVar13.index + 8);
      pFVar12 = pFVar10;
      for (psVar11 = *(size_t **)RVar13.index; psVar11 != psVar3; psVar11 = psVar11 + 4) {
        sVar4 = *psVar11;
        sVar5 = psVar11[1];
        pMVar6 = (Module *)psVar11[3];
        pFVar12->inst = (Instance *)psVar11[2];
        pFVar12->mod = pMVar6;
        (pFVar12->func).index = sVar4;
        pFVar12->values = (int)sVar5;
        pFVar12->offset = (int)(sVar5 >> 0x20);
        pFVar12 = pFVar12 + 1;
      }
      if (*(void **)RVar13.index != (void *)0x0) {
        operator_delete(*(void **)RVar13.index);
      }
      *(Frame **)RVar13.index = pFVar10;
      *(long *)(RVar13.index + 8) = (lVar2 - lVar1) + (long)pFVar10;
      *(Frame **)(RVar13.index + 0x10) = pFVar10 + (long)this_00;
    }
    return;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}